

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

void cf_socket_destroy(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  
  pvVar1 = cf->ctx;
  cf_socket_close(cf,data);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"destroy");
  }
  Curl_bufq_free((bufq *)((long)pvVar1 + 0xa0));
  (*Curl_cfree)(pvVar1);
  cf->ctx = (void *)0x0;
  return;
}

Assistant:

static void cf_socket_destroy(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;

  cf_socket_close(cf, data);
  CURL_TRC_CF(data, cf, "destroy");
  Curl_bufq_free(&ctx->recvbuf);
  free(ctx);
  cf->ctx = NULL;
}